

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O2

void __thiscall duckdb::ReadCSVData::ReadCSVData(ReadCSVData *this)

{
  BaseCSVData::BaseCSVData(&this->super_BaseCSVData);
  (this->super_BaseCSVData).super_TableFunctionData.super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__ReadCSVData_02795ee8;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->column_info).super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_info).super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_info).super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CSVSchema::CSVSchema(&this->csv_schema,false);
  return;
}

Assistant:

ReadCSVData::ReadCSVData() {
}